

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

void __thiscall
UnicodeFullTest_string_cast_Test<std::pair<char8_t,_char16_t>_>::TestBody
          (UnicodeFullTest_string_cast_Test<std::pair<char8_t,_char16_t>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar1;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> lhs;
  char32_t (*in_RDX) [5];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *in_string;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX_01;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX_02;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX_03;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX_04;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *in_string_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX_05;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX_06;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX_07;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX_08;
  char8_t *extraout_RDX_10;
  char8_t *extraout_RDX_11;
  char8_t *extraout_RDX_12;
  char8_t *extraout_RDX_13;
  char8_t *extraout_RDX_14;
  char8_t *pcVar2;
  jessilib *this_00;
  pointer *__ptr;
  _Alloc_hider _Var3;
  char8_t *pcVar4;
  bool bVar5;
  decode_result dVar6;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> rhs;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> rhs_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_01;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_02;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_03;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_04;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> lhs_00;
  AssertionResult gtest_ar_;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> abcd_string_view;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> abcd_str;
  long *local_90;
  AssertHelper local_88 [8];
  char local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_70;
  jessilib *local_50;
  char8_t *local_48;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_40;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *extraout_RDX;
  char8_t *extraout_RDX_09;
  
  jessilib::string_cast<char8_t,char32_t[5]>(&local_40,(jessilib *)L"ABCD",in_RDX);
  local_50 = (jessilib *)local_40._M_string_length;
  local_48 = local_40._M_dataplus._M_p;
  jessilib::string_cast<char16_t,std::__cxx11::u8string>(&local_70,(jessilib *)&local_40,in_string);
  rhs._M_str = local_70._M_dataplus._M_p;
  rhs._M_len = local_70._M_string_length;
  lhs_00._M_str = local_40._M_dataplus._M_p;
  lhs_00._M_len = local_40._M_string_length;
  local_80[0] = jessilib::equals<char8_t,char16_t>(lhs_00,rhs);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  paVar1 = &local_70.field_2;
  in_string_00 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 2 + 2);
    in_string_00 = extraout_RDX_00;
  }
  if (local_80[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_70,local_80,
               "equals(abcd_str, string_cast<typename TypeParam::second_type>(abcd_str))","false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x9d,(char *)local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    in_string_00 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      in_string_00 = extraout_RDX_02;
    }
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
      in_string_00 = extraout_RDX_03;
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
    in_string_00 = extraout_RDX_04;
  }
  _Var3._M_p = local_40._M_dataplus._M_p;
  bVar5 = (jessilib *)local_40._M_string_length == (jessilib *)0x0;
  if (!bVar5) {
    in_string_01._M_str = (char8_t *)in_string_00;
    in_string_01._M_len = (size_t)local_40._M_dataplus._M_p;
    dVar6 = jessilib::decode_codepoint_utf8<char8_t>
                      ((jessilib *)local_40._M_string_length,in_string_01);
    in_string_00 = (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)dVar6.units;
    if (in_string_00 == (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)0x0) {
      bVar5 = false;
    }
    else {
      do {
        local_40._M_string_length = local_40._M_string_length + -(long)in_string_00;
        bVar5 = (jessilib *)local_40._M_string_length == (jessilib *)0x0;
        if (bVar5) break;
        _Var3._M_p = _Var3._M_p + (long)in_string_00;
        in_string_02._M_str = (char8_t *)in_string_00;
        in_string_02._M_len = (size_t)_Var3._M_p;
        dVar6 = jessilib::decode_codepoint_utf8<char8_t>
                          ((jessilib *)local_40._M_string_length,in_string_02);
        in_string_00 = (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)dVar6.units;
      } while (in_string_00 != (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)0x0);
    }
  }
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_80[0] = bVar5;
  if (bVar5 == false) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_70,local_80,"is_valid(abcd_str)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x9e,(char *)local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    in_string_00 = extraout_RDX_05;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      in_string_00 = extraout_RDX_06;
    }
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
      in_string_00 = extraout_RDX_07;
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
    in_string_00 = extraout_RDX_08;
  }
  lhs._M_str = local_48;
  lhs._M_len = (size_t)local_50;
  jessilib::string_cast<char16_t,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
            (&local_70,(jessilib *)&local_50,in_string_00);
  rhs_00._M_str = local_70._M_dataplus._M_p;
  rhs_00._M_len = local_70._M_string_length;
  local_80[0] = jessilib::equals<char8_t,char16_t>(lhs,rhs_00);
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pcVar2 = extraout_RDX_09;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 2 + 2);
    pcVar2 = extraout_RDX_10;
  }
  if (local_80[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_70,local_80,
               "equals(abcd_string_view, string_cast<typename TypeParam::second_type>(abcd_string_view))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xa1,(char *)local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    pcVar2 = extraout_RDX_11;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      pcVar2 = extraout_RDX_12;
    }
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
      pcVar2 = extraout_RDX_13;
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
    pcVar2 = extraout_RDX_14;
  }
  pcVar4 = local_48;
  this_00 = local_50;
  bVar5 = local_50 == (jessilib *)0x0;
  if (!bVar5) {
    in_string_03._M_str = pcVar2;
    in_string_03._M_len = (size_t)local_48;
    dVar6 = jessilib::decode_codepoint_utf8<char8_t>(local_50,in_string_03);
    pcVar2 = (char8_t *)dVar6.units;
    if (pcVar2 == (char8_t *)0x0) {
      bVar5 = false;
    }
    else {
      do {
        this_00 = this_00 + -(long)pcVar2;
        bVar5 = this_00 == (jessilib *)0x0;
        if (bVar5) break;
        pcVar4 = pcVar4 + (long)pcVar2;
        in_string_04._M_str = pcVar2;
        in_string_04._M_len = (size_t)pcVar4;
        dVar6 = jessilib::decode_codepoint_utf8<char8_t>(this_00,in_string_04);
        pcVar2 = (char8_t *)dVar6.units;
      } while (pcVar2 != (char8_t *)0x0);
    }
  }
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_80[0] = bVar5;
  if (bVar5 == false) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_70,local_80,"is_valid(abcd_string_view)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xa2,(char *)local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, string_cast) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");
	std::basic_string_view<typename TypeParam::first_type> abcd_string_view = abcd_str;

	EXPECT_TRUE(equals(abcd_str,
		string_cast<typename TypeParam::second_type>(abcd_str)));
	EXPECT_TRUE(is_valid(abcd_str));

	EXPECT_TRUE(equals(abcd_string_view,
		string_cast<typename TypeParam::second_type>(abcd_string_view)));
	EXPECT_TRUE(is_valid(abcd_string_view));
}